

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

AnyCellmlElementPtr __thiscall libcellml::Annotator::item(Annotator *this,string *id)

{
  LoggerImpl *pLVar1;
  bool bVar2;
  AnnotatorImpl *pAVar3;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  AnyCellmlElementPtr AVar5;
  vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  pAVar3 = (AnnotatorImpl *)Logger::pFunc((Logger *)id);
  AnnotatorImpl::update(pAVar3);
  pAVar3 = (AnnotatorImpl *)Logger::pFunc((Logger *)id);
  bVar2 = AnnotatorImpl::exists(pAVar3,in_RDX,0,true);
  if (bVar2) {
    items(&local_40,(Annotator *)id,in_RDX);
    (this->super_Logger)._vptr_Logger =
         (_func_int **)
         ((local_40.
           super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (this->super_Logger).mPimpl = (LoggerImpl *)0x0;
    pLVar1 = (LoggerImpl *)
             ((local_40.
               super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    ((local_40.
      super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Logger).mPimpl = pLVar1;
    ((local_40.
      super__Vector_base<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    std::
    vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ::~vector(&local_40);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    AVar5 = AnyCellmlElement::AnyCellmlElementImpl::create();
    _Var4 = AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar5.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::item(const std::string &id)
{
    pFunc()->update();
    return pFunc()->exists(id, 0, true) ? std::move(items(id)[0]) : AnyCellmlElement::AnyCellmlElementImpl::create();
}